

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O3

int __thiscall
CP::priority_queue<int,_std::less<int>_>::find_level
          (priority_queue<int,_std::less<int>_> *this,int k)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  
  uVar3 = this->mSize;
  uVar4 = uVar3 & 0xffffffff;
  uVar5 = (int)uVar3 - 1;
  uVar1 = 0xffffffff;
  if ((int)uVar5 < -1) {
    uVar1 = uVar5;
  }
  do {
    uVar4 = uVar4 - 1;
    uVar5 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar5;
    if ((int)uVar5 < 0) goto LAB_00101457;
  } while (this->mData[(uint)uVar4 & 0x7fffffff] != k);
  uVar1 = uVar5;
  if (uVar5 == 0) {
    iVar2 = 0;
  }
  else {
LAB_00101457:
    dVar6 = log2((double)(int)uVar1);
    iVar2 = (int)dVar6;
  }
  return iVar2;
}

Assistant:

int CP::priority_queue<T, C>::find_level(T k) const {
    int i = mSize - 1;
    for (; i >= 0; --i) {
        if (mData[i] == k) {
            break;
        }
    }
    return i == 0 ? i : log2(i);
}